

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

size_t bitset_maximum(bitset_t *bitset)

{
  unsigned_long_long input_num;
  int iVar1;
  long *in_RDI;
  uint64_t w;
  size_t k;
  long local_18;
  
  local_18 = in_RDI[1];
  while( true ) {
    if (local_18 == 0) {
      return 0;
    }
    input_num = *(unsigned_long_long *)(*in_RDI + (local_18 + -1) * 8);
    if (input_num != 0) break;
    local_18 = local_18 + -1;
  }
  iVar1 = roaring_leading_zeroes(input_num);
  return (long)(0x3f - iVar1) + (local_18 + -1) * 0x40;
}

Assistant:

size_t bitset_maximum(const bitset_t *bitset) {
    for (size_t k = bitset->arraysize; k > 0; k--) {
        uint64_t w = bitset->array[k - 1];
        if (w != 0) {
            return 63 - roaring_leading_zeroes(w) + (k - 1) * 64;
        }
    }
    return 0;
}